

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  int *piVar13;
  float *pfVar14;
  float *pfVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  float *pfVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  uint uVar30;
  int iVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 in_XMM5_Qb;
  
  pfVar8 = this->gPartials[parIndex];
  pfVar9 = this->gStateFrequencies[stateFrequenciesIndex];
  pfVar10 = this->gTransitionMatrices[probIndex];
  pfVar11 = this->gTransitionMatrices[firstDerivativeIndex];
  pfVar12 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  if ((childIndex < this->kTipCount) &&
     (piVar13 = this->gTipStates[childIndex], piVar13 != (int *)0x0)) {
    iVar31 = this->kCategoryCount;
    uVar4 = this->kPatternCount;
    uVar27 = (ulong)uVar4;
    if (0 < (long)iVar31) {
      iVar5 = this->kPartialsPaddedStateCount;
      iVar6 = this->kMatrixSize;
      uVar7 = this->kStateCount;
      lVar23 = 0;
      lVar26 = 0;
      iVar19 = 0;
      do {
        if (0 < (int)uVar4) {
          lVar26 = (long)(int)lVar26;
          uVar28 = 0;
          fVar37 = pfVar12[lVar23];
          pfVar25 = this->integrationTmp;
          pfVar14 = this->firstDerivTmp;
          iVar20 = this->kTransPaddedStateCount;
          pfVar29 = pfVar8 + lVar26;
          iVar22 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar24 = 0;
              lVar21 = (long)piVar13[uVar28] + (long)iVar19;
              do {
                auVar33 = ZEXT416((uint)fVar37);
                auVar34 = vfmadd213ss_fma(ZEXT416((uint)(pfVar10[lVar21] * pfVar29[uVar24])),auVar33
                                          ,ZEXT416((uint)pfVar25[(long)iVar22 + uVar24]));
                pfVar25[(long)iVar22 + uVar24] = auVar34._0_4_;
                pfVar15 = pfVar11 + lVar21;
                lVar21 = lVar21 + iVar20;
                auVar34 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar15 * pfVar29[uVar24])),auVar33,
                                          ZEXT416((uint)pfVar14[(long)iVar22 + uVar24]));
                pfVar14[(long)iVar22 + uVar24] = auVar34._0_4_;
                uVar24 = uVar24 + 1;
              } while (uVar7 != uVar24);
              iVar22 = iVar22 + (int)uVar24;
            }
            lVar26 = lVar26 + iVar5;
            uVar28 = uVar28 + 1;
            pfVar29 = pfVar29 + iVar5;
          } while (uVar28 != uVar27);
        }
        iVar19 = iVar19 + iVar6;
        lVar23 = lVar23 + 1;
      } while (lVar23 != iVar31);
    }
  }
  else {
    iVar31 = this->kCategoryCount;
    uVar4 = this->kPatternCount;
    uVar27 = (ulong)uVar4;
    if (0 < (long)iVar31) {
      uVar7 = this->kStateCount;
      iVar5 = this->kMatrixSize;
      iVar19 = 0;
      lVar26 = 0;
      pfVar29 = this->gPartials[childIndex];
      lVar23 = 0;
      iVar6 = this->kPartialsPaddedStateCount;
      do {
        if (0 < (int)uVar4) {
          auVar34._0_8_ = (double)pfVar12[lVar23];
          auVar34._8_8_ = in_XMM5_Qb;
          lVar26 = (long)(int)lVar26;
          uVar30 = 0;
          lVar21 = 0;
          pfVar14 = this->integrationTmp;
          pfVar15 = this->firstDerivTmp;
          pfVar25 = pfVar29 + lVar26;
          do {
            if (0 < (int)uVar7) {
              lVar21 = (long)(int)lVar21;
              uVar28 = 0;
              iVar20 = iVar19;
              do {
                dVar38 = 0.0;
                dVar32 = 0.0;
                uVar24 = 0;
                do {
                  pfVar1 = pfVar25 + uVar24;
                  lVar17 = (long)iVar20 + uVar24;
                  lVar18 = (long)iVar20 + uVar24;
                  uVar24 = uVar24 + 1;
                  dVar32 = dVar32 + (double)(*pfVar1 * pfVar10[lVar17]);
                  dVar38 = dVar38 + (double)(*pfVar1 * pfVar11[lVar18]);
                } while (uVar7 != uVar24);
                iVar20 = iVar20 + uVar7 + 1;
                auVar43._0_8_ = (double)pfVar14[lVar21];
                auVar43._8_8_ = in_XMM5_Qb;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = dVar32 * (double)pfVar8[lVar26 + uVar28];
                auVar33 = vfmadd231sd_fma(auVar43,auVar34,auVar41);
                pfVar14[lVar21] = (float)auVar33._0_8_;
                lVar17 = lVar26 + uVar28;
                auVar44._0_8_ = (double)pfVar15[lVar21];
                auVar44._8_8_ = in_XMM5_Qb;
                uVar28 = uVar28 + 1;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = dVar38 * (double)pfVar8[lVar17];
                auVar33 = vfmadd231sd_fma(auVar44,auVar34,auVar33);
                pfVar15[lVar21] = (float)auVar33._0_8_;
                lVar21 = lVar21 + 1;
              } while (uVar28 != uVar7);
            }
            lVar26 = lVar26 + iVar6;
            pfVar25 = pfVar25 + iVar6;
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar4);
        }
        lVar23 = lVar23 + 1;
        iVar19 = iVar19 + iVar5;
      } while (lVar23 != iVar31);
    }
  }
  if (0 < (int)uVar27) {
    lVar23 = 0;
    iVar31 = 0;
    do {
      iVar5 = this->kStateCount;
      if ((long)iVar5 < 1) {
        auVar42 = ZEXT864(0);
        fVar37 = 0.0;
      }
      else {
        auVar34 = ZEXT816(0) << 0x40;
        auVar42 = ZEXT864(0);
        lVar26 = 0;
        do {
          auVar33 = vfmadd231ss_fma(auVar42._0_16_,ZEXT416((uint)pfVar9[lVar26]),
                                    ZEXT416((uint)this->integrationTmp[iVar31 + lVar26]));
          auVar42 = ZEXT1664(auVar33);
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)pfVar9[lVar26]),
                                    ZEXT416((uint)this->firstDerivTmp[iVar31 + lVar26]));
          lVar26 = lVar26 + 1;
        } while (iVar5 != lVar26);
        iVar31 = iVar31 + iVar5;
        fVar37 = auVar34._0_4_;
      }
      dVar32 = log((double)auVar42._0_4_);
      this->outLogLikelihoodsTmp[lVar23] = (float)dVar32;
      this->outFirstDerivativesTmp[lVar23] = fVar37 / auVar42._0_4_;
      lVar23 = lVar23 + 1;
      uVar27 = (ulong)this->kPatternCount;
    } while (lVar23 < (long)uVar27);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar27 < 1) {
      *outSumLogLikelihood = 0.0;
      *outSumFirstDerivative = 0.0;
      goto LAB_0013927a;
    }
    uVar28 = 0;
    pfVar8 = this->gScaleBuffers[scalingFactorsIndex];
    pfVar9 = this->outLogLikelihoodsTmp;
    do {
      pfVar9[uVar28] = pfVar8[uVar28] + pfVar9[uVar28];
      uVar28 = uVar28 + 1;
    } while ((uVar27 & 0xffffffff) != uVar28);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  if (0 < (int)uVar27) {
    pdVar16 = this->gPatternWeights;
    pfVar8 = this->outLogLikelihoodsTmp;
    pfVar9 = this->outFirstDerivativesTmp;
    uVar28 = 0;
    do {
      auVar35._0_8_ = (double)pfVar8[uVar28];
      auVar35._8_8_ = in_XMM5_Qb;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = pdVar16[uVar28];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *outSumLogLikelihood;
      auVar34 = vfmadd213sd_fma(auVar39,auVar35,auVar2);
      *outSumLogLikelihood = auVar34._0_8_;
      auVar36._0_8_ = (double)pfVar9[uVar28];
      auVar36._8_8_ = in_XMM5_Qb;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = pdVar16[uVar28];
      uVar28 = uVar28 + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *outSumFirstDerivative;
      auVar34 = vfmadd213sd_fma(auVar40,auVar36,auVar3);
      *outSumFirstDerivative = auVar34._0_8_;
    } while ((uVar27 & 0xffffffff) != uVar28);
  }
LAB_0013927a:
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}